

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O1

double xc_bessel_K1(double x)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if (x <= 0.0) {
    xc_bessel_K1_cold_1();
  }
  else {
    if (4.450147717014403e-308 <= x) {
      if (2.0 < x) {
        dVar2 = exp(-x);
        dVar3 = xc_bessel_K1_scaled(x);
        return dVar3 * dVar2;
      }
      dVar4 = log(x * 0.5);
      dVar5 = xc_bessel_I1(x);
      dVar7 = x * 0.5 * x + -1.0;
      uVar1 = 0xc;
      dVar2 = 0.0;
      dVar3 = 0.0;
      do {
        dVar6 = dVar3;
        dVar3 = dVar2;
        dVar2 = ((dVar7 + dVar7) * dVar3 - dVar6) + ak02_data[uVar1 + 0xc];
        uVar1 = uVar1 - 1;
      } while (1 < uVar1);
      return dVar4 * dVar5 + ((dVar2 - dVar6) * 0.5 + 0.75) / x;
    }
    xc_bessel_K1_cold_2();
  }
  return 0.0;
}

Assistant:

GPU_FUNCTION
double xc_bessel_K1(const double x)
{
  double r = 0.0;

  if(x <= 0.0) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Domain error in bessel_K1\n");
#endif
  } else if(x<2.0*DBL_MIN) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Overflow error in bessel_K1\n");
#endif
  }
  else if(x <= 2.0)
    r = log(0.5*x)*xc_bessel_I1(x) + (0.75 + xc_cheb_eval(0.5*x*x - 1.0, bk1_data, 11))/x;
  else
    r = exp(-x)*xc_bessel_K1_scaled(x);

  return r;
}